

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O0

void Node_compile_c_ko(Node *node,int ko)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int out_1;
  int again_1;
  int out;
  int again;
  int qok;
  int qko;
  int ok_2;
  int ok_1;
  int next;
  int ok;
  int len;
  int ko_local;
  Node *node_local;
  
  __stream = output;
  if (node != (Node *)0x0) {
    switch(node->type) {
    case 1:
      fprintf(_stderr,"\ninternal error #1 (%s)\n",(node->rule).name);
      exit(1);
    default:
      fprintf(_stderr,"\nNode_compile_c_ko: illegal node type %d\n",(ulong)(uint)node->type);
      exit(1);
    case 3:
      fprintf((FILE *)output,"  if (!yy_%s(G)) ",*(undefined8 *)((node->rule).name + 0x18));
      if ((node->rule).errblock == (char *)0x0) {
        fprintf((FILE *)output," goto l%d;\n",(ulong)(uint)ko);
      }
      else {
        fprintf((FILE *)output,"{ ");
        callErrBlock(node);
        fprintf((FILE *)output," goto l%d; }\n",(ulong)(uint)ko);
      }
      if ((node->rule).variables != (Node *)0x0) {
        fprintf((FILE *)output,"  yyDo(G, yySet, %d, 0, \"yySet\");\n",
                (ulong)(uint)(((node->rule).variables)->variable).offset);
      }
      break;
    case 4:
      fprintf((FILE *)output,"  if (!yymatchDot(G)) goto l%d;",(ulong)(uint)ko);
      break;
    case 5:
    case 6:
      sVar3 = strlen((node->rule).name);
      if ((int)sVar3 == 1) {
        if (*(node->rule).name == '\'') {
          fprintf((FILE *)output,"  if (!yymatchChar(G, \'\\\'\')) goto l%d;\n",(ulong)(uint)ko);
        }
        else {
          fprintf((FILE *)output,"  if (!yymatchChar(G, \'%s\')) goto l%d;\n",(node->rule).name,
                  (ulong)(uint)ko);
        }
      }
      else if (((int)sVar3 == 2) && (*(node->rule).name == '\\')) {
        fprintf((FILE *)output,"  if (!yymatchChar(G, \'%s\')) goto l%d;\n",(node->rule).name,
                (ulong)(uint)ko);
      }
      else {
        fprintf((FILE *)output,"  if (!yymatchString(G, \"%s\")) goto l%d;\n",(node->rule).name,
                (ulong)(uint)ko);
      }
      break;
    case 7:
      pcVar4 = makeCharClass((node->cclass).value);
      pcVar5 = yyqq((node->rule).name);
      fprintf((FILE *)__stream,
              "  if (!yymatchClass(G, (const unsigned char *)\"%s\", \"%s\")) goto l%d;\n",pcVar4,
              pcVar5,(ulong)(uint)ko);
      break;
    case 8:
      fprintf((FILE *)output,"  yyDo(G, yy%s, G->begin, G->end, \"yy%s\");\n",
              (node->rule).expression,(node->rule).expression);
      break;
    case 9:
      fprintf((FILE *)output,"  yyText(G, G->begin, G->end);  if (!(%s)) goto l%d;",
              (node->rule).name,(ulong)(uint)ko);
      break;
    case 10:
      iVar1 = yyl();
      begin();
      save(iVar1);
      for (_len = (node->name).rule; _len != (Node *)0x0; _len = (_len->rule).next) {
        if ((_len->rule).next == (Node *)0x0) {
          Node_compile_c_ko(_len,ko);
        }
        else {
          iVar2 = yyl();
          Node_compile_c_ko(_len,iVar2);
          jump(iVar1);
          label(iVar2);
          restore(iVar1);
        }
      }
      end();
      label(iVar1);
      break;
    case 0xb:
      for (_len = (node->name).rule; _len != (Node *)0x0; _len = (_len->rule).next) {
        Node_compile_c_ko(_len,ko);
      }
      break;
    case 0xc:
      iVar1 = yyl();
      begin();
      save(iVar1);
      Node_compile_c_ko((node->name).rule,ko);
      restore(iVar1);
      end();
      break;
    case 0xd:
      iVar1 = yyl();
      begin();
      save(iVar1);
      Node_compile_c_ko((node->name).rule,iVar1);
      jump(ko);
      label(iVar1);
      restore(iVar1);
      end();
      break;
    case 0xe:
      iVar1 = yyl();
      iVar2 = yyl();
      begin();
      save(iVar1);
      Node_compile_c_ko((node->name).rule,iVar1);
      jump(iVar2);
      label(iVar1);
      restore(iVar1);
      end();
      label(iVar2);
      break;
    case 0xf:
      iVar1 = yyl();
      iVar2 = yyl();
      label(iVar1);
      begin();
      save(iVar2);
      Node_compile_c_ko((node->name).rule,iVar2);
      jump(iVar1);
      label(iVar2);
      restore(iVar2);
      end();
      break;
    case 0x10:
      iVar1 = yyl();
      iVar2 = yyl();
      Node_compile_c_ko((node->name).rule,ko);
      label(iVar1);
      begin();
      save(iVar2);
      Node_compile_c_ko((node->name).rule,iVar2);
      jump(iVar1);
      label(iVar2);
      restore(iVar2);
      end();
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/compile.c"
                ,0xb1,"void Node_compile_c_ko(Node *, int)");
}

Assistant:

static void Node_compile_c_ko(Node *node, int ko)
{
  assert(node);
  switch (node->type)
    {
    case Rule:
      fprintf(stderr, "\ninternal error #1 (%s)\n", node->rule.name);
      exit(1);
      break;

    case Dot:
      fprintf(output, "  if (!yymatchDot(G)) goto l%d;", ko);
      break;

    case Name:
      fprintf(output, "  if (!yy_%s(G)) ", node->name.rule->rule.name);
      if(((struct Any*) node)->errblock) {
	fprintf(output, "{ ");
	callErrBlock(node);
	fprintf(output, " goto l%d; }\n", ko);
      } else {
	fprintf(output, " goto l%d;\n", ko);
      }
      if (node->name.variable)
	fprintf(output, "  yyDo(G, yySet, %d, 0, \"yySet\");\n", node->name.variable->variable.offset);
      break;

    case Character:
    case String:
      {
	int len= strlen(node->string.value);
	if (1 == len)
	  {
	    if ('\'' == node->string.value[0])
	      fprintf(output, "  if (!yymatchChar(G, '\\'')) goto l%d;\n", ko);
	    else
	      fprintf(output, "  if (!yymatchChar(G, '%s')) goto l%d;\n", node->string.value, ko);
	  }
	else
	  if (2 == len && '\\' == node->string.value[0])
	    fprintf(output, "  if (!yymatchChar(G, '%s')) goto l%d;\n", node->string.value, ko);
	  else
	    fprintf(output, "  if (!yymatchString(G, \"%s\")) goto l%d;\n", node->string.value, ko);
      }
      break;

    case Class:
      fprintf(output, "  if (!yymatchClass(G, (const unsigned char *)\"%s\", \"%s\")) goto l%d;\n", makeCharClass(node->cclass.value), yyqq((char*)node->cclass.value), ko);
      break;

    case Action:
      fprintf(output, "  yyDo(G, yy%s, G->begin, G->end, \"yy%s\");\n", node->action.name, node->action.name);
      break;

    case Predicate:
      fprintf(output, "  yyText(G, G->begin, G->end);  if (!(%s)) goto l%d;", node->action.text, ko);
      break;

    case Alternate:
      {
        int ok= yyl();
        begin();
        save(ok);
        for (node= node->alternate.first;  node;  node= node->alternate.next)
          if (node->alternate.next)
            {
              int next= yyl();
              Node_compile_c_ko(node, next);
              jump(ok);
              label(next);
              restore(ok);
            }
          else
            Node_compile_c_ko(node, ko);
        end();
        label(ok);
      }
      break;

    case Sequence:
      for (node= node->sequence.first;  node;  node= node->sequence.next)
        Node_compile_c_ko(node, ko);
      break;

    case PeekFor:
      {
        int ok= yyl();
        begin();
        save(ok);
        Node_compile_c_ko(node->peekFor.element, ko);
        restore(ok);
        end();
      }
      break;

    case PeekNot:
      {
        int ok= yyl();
        begin();
        save(ok);
        Node_compile_c_ko(node->peekFor.element, ok);
        jump(ko);
        label(ok);
        restore(ok);
        end();
      }
      break;

    case Query:
      {
        int qko= yyl(), qok= yyl();
        begin();
        save(qko);
        Node_compile_c_ko(node->query.element, qko);
        jump(qok);
        label(qko);
        restore(qko);
        end();
        label(qok);
      }
      break;

    case Star:
      {
        int again= yyl(), out= yyl();
        label(again);
        begin();
        save(out);
        Node_compile_c_ko(node->star.element, out);
        jump(again);
        label(out);
        restore(out);
        end();
      }
      break;

    case Plus:
      {
        int again= yyl(), out= yyl();
        Node_compile_c_ko(node->plus.element, ko);
        label(again);
        begin();
        save(out);
        Node_compile_c_ko(node->plus.element, out);
        jump(again);
        label(out);
        restore(out);
        end();
      }
      break;

    default:
      fprintf(stderr, "\nNode_compile_c_ko: illegal node type %d\n", node->type);
      exit(1);
    }
}